

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool mkvmuxer::anon_unknown_12::CopyChromaticity
               (PrimaryChromaticity *src,PrimaryChromaticityPtr *dst)

{
  PrimaryChromaticity *this;
  pointer pPVar1;
  unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
  *in_RSI;
  PrimaryChromaticity *in_RDI;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  bool local_1;
  
  if (in_RSI == (unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                 *)0x0) {
    local_1 = false;
  }
  else {
    this = (PrimaryChromaticity *)operator_new(8,(nothrow_t *)&std::nothrow);
    if (this != (PrimaryChromaticity *)0x0) {
      in_stack_ffffffffffffffac = PrimaryChromaticity::x(in_RDI);
      in_stack_ffffffffffffffa8 = PrimaryChromaticity::y(in_RDI);
      PrimaryChromaticity::PrimaryChromaticity
                (this,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    }
    std::
    unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>::
    reset(in_RSI,(pointer)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    pPVar1 = std::
             unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
             ::get(in_RSI);
    if (pPVar1 == (pointer)0x0) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool CopyChromaticity(const PrimaryChromaticity* src,
                      PrimaryChromaticityPtr* dst) {
  if (!dst)
    return false;

  dst->reset(new (std::nothrow) PrimaryChromaticity(src->x(), src->y()));
  if (!dst->get())
    return false;

  return true;
}